

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundConfigTab.cpp
# Opt level: O0

void __thiscall
DeviceGroup::init<AudioEnumerator>
          (DeviceGroup *this,AudioEnumerator *enumerator,int backend,int device)

{
  QComboBox *this_00;
  QLabel *pQVar1;
  bool bVar2;
  QStringList local_38;
  int local_20;
  int local_1c;
  int device_local;
  int backend_local;
  AudioEnumerator *enumerator_local;
  DeviceGroup *this_local;
  
  this_00 = this->mApiCombo;
  local_20 = device;
  local_1c = backend;
  _device_local = enumerator;
  enumerator_local = (AudioEnumerator *)this;
  AudioEnumerator::backendNames(&local_38,enumerator);
  QComboBox::addItems(this_00,&local_38);
  QList<QString>::~QList(&local_38);
  QComboBox::setCurrentIndex((int)this->mApiCombo);
  populateDevices<AudioEnumerator>(this,_device_local);
  QComboBox::setCurrentIndex((int)this->mDeviceCombo);
  pQVar1 = this->mErrorLabel;
  bVar2 = AudioEnumerator::backendIsAvailable(_device_local,local_1c);
  (**(code **)(*(long *)pQVar1 + 0x68))(pQVar1,(bVar2 ^ 0xffU) & 1);
  return;
}

Assistant:

void init(Enumerator const& enumerator, int backend, int device) {
        mApiCombo->addItems(enumerator.backendNames());
        mApiCombo->setCurrentIndex(backend);
        populateDevices(enumerator);
        mDeviceCombo->setCurrentIndex(device);
        mErrorLabel->setVisible(!enumerator.backendIsAvailable(backend));
    }